

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

SPARSE_TEXTURE_FLAGS
Diligent::VkSparseImageFormatFlagsToSparseTextureFlags(VkSparseImageFormatFlags Flags)

{
  SPARSE_TEXTURE_FLAGS SVar1;
  uint uVar2;
  bool bVar3;
  string msg;
  string local_50;
  
  if (Flags == 0) {
    SVar1 = SPARSE_TEXTURE_FLAG_NONE;
  }
  else {
    SVar1 = SPARSE_TEXTURE_FLAG_NONE;
    do {
      uVar2 = -Flags & Flags;
      if (uVar2 == 4) {
        SVar1 = SVar1 | SPARSE_TEXTURE_FLAG_LAST;
      }
      else if (uVar2 == 2) {
        SVar1 = SVar1 | SPARSE_TEXTURE_FLAG_ALIGNED_MIP_SIZE;
      }
      else if (uVar2 == 1) {
        SVar1 = SVar1 | SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL;
      }
      else {
        FormatString<char[36]>(&local_50,(char (*) [36])"Unexpected sparse image format flag");
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"VkSparseImageFormatFlagsToSparseTextureFlags",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x838);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      bVar3 = uVar2 != Flags;
      Flags = uVar2 ^ Flags;
    } while (bVar3);
  }
  return SVar1;
}

Assistant:

SPARSE_TEXTURE_FLAGS VkSparseImageFormatFlagsToSparseTextureFlags(VkSparseImageFormatFlags Flags)
{
    SPARSE_TEXTURE_FLAGS Result = SPARSE_TEXTURE_FLAG_NONE;
    while (Flags != 0)
    {
        VkSparseImageFormatFlagBits FlagBit = static_cast<VkSparseImageFormatFlagBits>(ExtractLSB(Flags));
        static_assert(SPARSE_TEXTURE_FLAG_LAST == (1u << 2), "This function must be updated to handle new sparse texture flag");
        switch (FlagBit)
        {
            // clang-format off
            case VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT:         Result |= SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL;         break;
            case VK_SPARSE_IMAGE_FORMAT_ALIGNED_MIP_SIZE_BIT:       Result |= SPARSE_TEXTURE_FLAG_ALIGNED_MIP_SIZE;       break;
            case VK_SPARSE_IMAGE_FORMAT_NONSTANDARD_BLOCK_SIZE_BIT: Result |= SPARSE_TEXTURE_FLAG_NONSTANDARD_BLOCK_SIZE; break;
            // clang-format on
            default:
                UNEXPECTED("Unexpected sparse image format flag");
        }
    }
    return Result;
}